

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O3

int ecjpake_ecp_add3(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *A,
                    mbedtls_ecp_point *B,mbedtls_ecp_point *C)

{
  int iVar1;
  undefined1 local_50 [8];
  mbedtls_mpi one;
  
  one._8_8_ = B;
  mbedtls_mpi_init((mbedtls_mpi *)local_50);
  iVar1 = mbedtls_mpi_lset((mbedtls_mpi *)local_50,1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_muladd(grp,R,(mbedtls_mpi *)local_50,A,(mbedtls_mpi *)local_50,
                               (mbedtls_ecp_point *)one._8_8_);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_muladd(grp,R,(mbedtls_mpi *)local_50,R,(mbedtls_mpi *)local_50,C);
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_50);
  return iVar1;
}

Assistant:

static int ecjpake_ecp_add3(mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                            const mbedtls_ecp_point *A,
                            const mbedtls_ecp_point *B,
                            const mbedtls_ecp_point *C)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi one;

    mbedtls_mpi_init(&one);

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&one, 1));
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd(grp, R, &one, A, &one, B));
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd(grp, R, &one, R, &one, C));

cleanup:
    mbedtls_mpi_free(&one);

    return ret;
}